

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_draw_rectangle_pro(rf_rec rec,rf_vec2 origin,float rotation,rf_color color)

{
  uint local_40;
  uchar local_24;
  uchar uStack_23;
  uchar uStack_22;
  uchar uStack_21;
  float rotation_local;
  rf_color color_local;
  rf_vec2 origin_local;
  rf_rec rec_local;
  
  rf_get_shapes_texture();
  rf_gfx_enable_texture(local_40);
  rf_gfx_push_matrix();
  origin_local.x = rec.x;
  origin_local.y = rec.y;
  rf_gfx_translatef(origin_local.x,origin_local.y,0.0);
  rf_gfx_rotatef(rotation,0.0,0.0,1.0);
  rotation_local = origin.x;
  color_local = (rf_color)origin.y;
  rf_gfx_translatef(-rotation_local,-(float)color_local,0.0);
  rf_gfx_begin(RF_QUADS);
  rf_gfx_normal3f(0.0,0.0,1.0);
  local_24 = color.r;
  uStack_23 = color.g;
  uStack_22 = color.b;
  uStack_21 = color.a;
  rf_gfx_color4ub(local_24,uStack_23,uStack_22,uStack_21);
  rf_gfx_tex_coord2f((rf__ctx->field_0).rec_tex_shapes.x /
                     (float)(rf__ctx->field_0).tex_shapes.width,
                     (rf__ctx->field_0).rec_tex_shapes.y /
                     (float)(rf__ctx->field_0).tex_shapes.height);
  rf_gfx_vertex2f(0.0,0.0);
  rf_gfx_tex_coord2f((rf__ctx->field_0).rec_tex_shapes.x /
                     (float)(rf__ctx->field_0).tex_shapes.width,
                     ((rf__ctx->field_0).rec_tex_shapes.y + (rf__ctx->field_0).rec_tex_shapes.height
                     ) / (float)(rf__ctx->field_0).tex_shapes.height);
  rec_local.y = rec.height;
  rf_gfx_vertex2f(0.0,rec_local.y);
  rf_gfx_tex_coord2f(((rf__ctx->field_0).rec_tex_shapes.x + (rf__ctx->field_0).rec_tex_shapes.width)
                     / (float)(rf__ctx->field_0).tex_shapes.width,
                     ((rf__ctx->field_0).rec_tex_shapes.y + (rf__ctx->field_0).rec_tex_shapes.height
                     ) / (float)(rf__ctx->field_0).tex_shapes.height);
  rec_local.x = rec.width;
  rf_gfx_vertex2f(rec_local.x,rec_local.y);
  rf_gfx_tex_coord2f(((rf__ctx->field_0).rec_tex_shapes.x + (rf__ctx->field_0).rec_tex_shapes.width)
                     / (float)(rf__ctx->field_0).tex_shapes.width,
                     (rf__ctx->field_0).rec_tex_shapes.y /
                     (float)(rf__ctx->field_0).tex_shapes.height);
  rf_gfx_vertex2f(rec_local.x,0.0);
  rf_gfx_end();
  rf_gfx_pop_matrix();
  rf_gfx_disable_texture();
  return;
}

Assistant:

RF_API void rf_draw_rectangle_pro(rf_rec rec, rf_vec2 origin, float rotation, rf_color color)
{
    rf_gfx_enable_texture(rf_get_shapes_texture().id);

    rf_gfx_push_matrix();
    rf_gfx_translatef(rec.x, rec.y, 0.0f);
    rf_gfx_rotatef(rotation, 0.0f, 0.0f, 1.0f);
    rf_gfx_translatef(-origin.x, -origin.y, 0.0f);

    rf_gfx_begin(RF_QUADS);
    rf_gfx_normal3f(0.0f, 0.0f, 1.0f);
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);

    rf_gfx_tex_coord2f(rf_ctx.rec_tex_shapes.x / rf_ctx.tex_shapes.width, rf_ctx.rec_tex_shapes.y / rf_ctx.tex_shapes.height);
    rf_gfx_vertex2f(0.0f, 0.0f);

    rf_gfx_tex_coord2f(rf_ctx.rec_tex_shapes.x / rf_ctx.tex_shapes.width, (rf_ctx.rec_tex_shapes.y + rf_ctx.rec_tex_shapes.height) / rf_ctx.tex_shapes.height);
    rf_gfx_vertex2f(0.0f, rec.height);

    rf_gfx_tex_coord2f((rf_ctx.rec_tex_shapes.x + rf_ctx.rec_tex_shapes.width) / rf_ctx.tex_shapes.width, (rf_ctx.rec_tex_shapes.y + rf_ctx.rec_tex_shapes.height) / rf_ctx.tex_shapes.height);
    rf_gfx_vertex2f(rec.width, rec.height);

    rf_gfx_tex_coord2f((rf_ctx.rec_tex_shapes.x + rf_ctx.rec_tex_shapes.width) / rf_ctx.tex_shapes.width, rf_ctx.rec_tex_shapes.y / rf_ctx.tex_shapes.height);
    rf_gfx_vertex2f(rec.width, 0.0f);
    rf_gfx_end();
    rf_gfx_pop_matrix();

    rf_gfx_disable_texture();
}